

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O3

long hw_cpu_curr_freq(void)

{
  int iVar1;
  ulong uVar2;
  char sys_devices_system_cpu [32];
  stat struct_stat;
  char acStack_b8 [40];
  stat local_90;
  
  iVar1 = stat("/sys/devices/system/cpu/cpu0/cpufreq/scaling_cur_freq",&local_90);
  if ((iVar1 == 0) &&
     (iVar1 = slurpfile("/sys/devices/system/cpu/cpu0/cpufreq/scaling_cur_freq",acStack_b8,0x20),
     iVar1 != 0)) {
    uVar2 = strtoul(acStack_b8,(char **)0x0,10);
    return uVar2 / 1000 & 0xffffffff;
  }
  return 0;
}

Assistant:

long hw_cpu_curr_freq( void )
{
  long val = 0;
#ifdef HAVE_MAC_SYSCTL
  /* static int flag=0; */
  static int mib[2] = {CTL_HW, HW_CPU_FREQ};
  size_t vlen;
  /* if (flag == 0) { */
  /*   sysctlnametomib("hw.cpufrequency",mib,&mlen); */
  /*   printf("\nmib = { %i, %i, %i, %i};\n",mib[0],mib[1],mib[2],mib[3]); */
  /*   flag=1; */
  /* } */
  vlen = sizeof(long);
  sysctl(mib,2,&val,&vlen,NULL,0);
  val = val/1e6;
  
#else
  char *p;
  
  struct stat struct_stat;
  char sys_devices_system_cpu[32];
  const char *CPU_FREQ_SCALING_CUR_FREQ = "/sys/devices/system/cpu/cpu0/cpufreq/scaling_cur_freq";
  if ( stat(CPU_FREQ_SCALING_CUR_FREQ, &struct_stat) == 0 ) {
    if(slurpfile(CPU_FREQ_SCALING_CUR_FREQ, sys_devices_system_cpu, 32)) {
      p = sys_devices_system_cpu;
      val = (unsigned int) (strtoul( p, (char **)NULL , 10 ) / 1000 );
    }
  }
#endif //end HAVE_MAC_SYSCTL
  return val;
}